

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

int __thiscall mp::internal::TextReader<fmt::Locale>::ReadInt<int>(TextReader<fmt::Locale> *this)

{
  bool bVar1;
  int *unaff_retaddr;
  TextReader<fmt::Locale> *in_stack_00000008;
  CStringRef in_stack_00000010;
  int value;
  BasicCStringRef<char> local_18;
  int local_c;
  
  local_c = 0;
  bVar1 = DoReadOptionalInt<int>(in_stack_00000008,unaff_retaddr);
  if (!bVar1) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_18,"expected integer");
    ReportError<>(in_stack_00000008,in_stack_00000010);
  }
  return local_c;
}

Assistant:

Int ReadInt() {
    Int value = 0;
    if (!DoReadOptionalInt(value))
      ReportError("expected integer");
    return value;
  }